

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_image.h
# Opt level: O3

int stbi__create_png_image_raw
              (stbi__png *a,stbi_uc *raw,stbi__uint32 raw_len,int out_n,stbi__uint32 x,
              stbi__uint32 y,int depth,int color)

{
  ushort *puVar1;
  int a_00;
  uint uVar2;
  uint uVar3;
  uint uVar4;
  int iVar5;
  int iVar6;
  stbi_uc *psVar7;
  ulong uVar8;
  byte bVar9;
  uint uVar10;
  uint uVar11;
  long lVar12;
  long lVar13;
  stbi_uc *psVar14;
  uint uVar15;
  ulong uVar16;
  byte bVar17;
  long lVar18;
  byte bVar19;
  uint uVar20;
  int iVar21;
  long lVar23;
  ulong uVar24;
  stbi_uc *psVar25;
  uint uVar26;
  long lVar27;
  byte *pbVar28;
  long lVar29;
  uint uVar30;
  char *pcVar31;
  long lVar32;
  stbi_uc *psVar33;
  byte *pbVar34;
  uint uVar35;
  long *in_FS_OFFSET;
  bool bVar36;
  ulong local_68;
  ulong uVar22;
  
  bVar36 = depth == 0x10;
  uVar2 = x * out_n;
  uVar3 = uVar2 << bVar36;
  a_00 = a->s->img_n;
  lVar29 = (long)a_00;
  uVar4 = a_00 << bVar36;
  psVar7 = (stbi_uc *)stbi__malloc_mad3(x,y,out_n << bVar36,0);
  a->out = psVar7;
  if (psVar7 == (stbi_uc *)0x0) {
    pcVar31 = "outofmem";
  }
  else {
    iVar5 = stbi__mad3sizes_valid(a_00,x,depth,7);
    if (iVar5 == 0) {
      pcVar31 = "too large";
    }
    else {
      uVar10 = a_00 * x;
      uVar20 = uVar10 * depth + 7 >> 3;
      uVar22 = (ulong)uVar20;
      if (raw_len < (uVar20 + 1) * y) {
        pcVar31 = "not enough pixels";
      }
      else {
        if (y == 0) {
LAB_001bd681:
          if (depth != 0x10) {
            return 1;
          }
LAB_001bd690:
          if (uVar2 * y == 0) {
            return 1;
          }
          psVar7 = a->out;
          lVar29 = 0;
          do {
            puVar1 = (ushort *)(psVar7 + lVar29 * 2);
            *puVar1 = *puVar1 << 8 | *puVar1 >> 8;
            lVar29 = lVar29 + 1;
          } while (uVar2 * y != (int)lVar29);
          return 1;
        }
        bVar17 = *raw;
        pcVar31 = "invalid filter";
        if (bVar17 < 5) {
          lVar27 = (long)(out_n << bVar36);
          iVar6 = x - 1;
          uVar8 = (ulong)y;
          psVar7 = a->out;
          lVar12 = -lVar27;
          lVar32 = -(ulong)uVar3;
          uVar16 = 0;
          lVar18 = 0;
          iVar5 = 0 << bVar36;
          local_68 = (ulong)x;
          do {
            if (depth < 8) {
              if (x < uVar20) {
                pcVar31 = "invalid width";
                goto LAB_001bcbb6;
              }
              psVar7 = psVar7 + (uVar2 - uVar20);
              uVar4 = 1;
              local_68 = uVar22;
            }
            if (lVar18 == 0) {
              bVar17 = ""[bVar17];
            }
            if (0 < (int)uVar4) {
              uVar24 = 0;
              do {
                switch(bVar17) {
                case 0:
                case 1:
                case 5:
                case 6:
                  bVar9 = raw[uVar24 + 1];
                  goto LAB_001bcce6;
                case 2:
                case 4:
                  bVar9 = psVar7[uVar24 + lVar32];
                  break;
                case 3:
                  bVar9 = psVar7[uVar24 + lVar32] >> 1;
                  break;
                default:
                  goto switchD_001bccce_default;
                }
                bVar9 = bVar9 + raw[uVar24 + 1];
LAB_001bcce6:
                psVar7[uVar24] = bVar9;
switchD_001bccce_default:
                uVar24 = uVar24 + 1;
              } while (uVar4 != uVar24);
            }
            if (depth == 8) {
              lVar23 = (long)out_n;
              lVar13 = lVar29;
              if (a_00 != out_n) {
                psVar7[lVar29] = 0xff;
              }
LAB_001bcd3b:
              raw = raw + lVar13 + 1;
            }
            else {
              if (depth == 0x10) {
                lVar13 = (long)(int)uVar4;
                lVar23 = lVar27;
                if (a_00 != out_n) {
                  psVar7[lVar13] = 0xff;
                  psVar7[lVar13 + 1] = 0xff;
                }
                goto LAB_001bcd3b;
              }
              raw = raw + 2;
              lVar23 = 1;
            }
            psVar33 = psVar7 + lVar23;
            if (depth < 8 || a_00 == out_n) {
              uVar11 = ((int)local_68 + -1) * uVar4;
              switch(bVar17) {
              case 0:
                memcpy(psVar33,raw,(long)(int)uVar11);
                break;
              case 1:
                if (0 < (int)uVar11) {
                  uVar16 = 0;
                  do {
                    psVar33[uVar16] = psVar7[uVar16 + (lVar23 - (int)uVar4)] + raw[uVar16];
                    uVar16 = uVar16 + 1;
                  } while (uVar11 != uVar16);
                }
                break;
              case 2:
                if (0 < (int)uVar11) {
                  uVar16 = 0;
                  do {
                    psVar33[uVar16] = psVar33[uVar16 + lVar32] + raw[uVar16];
                    uVar16 = uVar16 + 1;
                  } while (uVar11 != uVar16);
                }
                break;
              case 3:
                if (0 < (int)uVar11) {
                  uVar16 = 0;
                  do {
                    psVar33[uVar16] =
                         (char)((uint)psVar7[uVar16 + (lVar23 - (int)uVar4)] +
                                (uint)psVar33[uVar16 + lVar32] >> 1) + raw[uVar16];
                    uVar16 = uVar16 + 1;
                  } while (uVar11 != uVar16);
                }
                break;
              case 4:
                if (0 < (int)uVar11) {
                  pbVar34 = psVar7 + (lVar23 - (int)uVar4);
                  uVar16 = 0;
                  do {
                    bVar17 = *pbVar34;
                    bVar9 = psVar33[lVar32];
                    bVar19 = pbVar34[lVar32];
                    iVar5 = ((uint)bVar9 + (uint)bVar17) - (uint)bVar19;
                    uVar26 = iVar5 - (uint)bVar17;
                    uVar35 = -uVar26;
                    if (0 < (int)uVar26) {
                      uVar35 = uVar26;
                    }
                    uVar15 = iVar5 - (uint)bVar9;
                    uVar26 = -uVar15;
                    if (0 < (int)uVar15) {
                      uVar26 = uVar15;
                    }
                    uVar30 = iVar5 - (uint)bVar19;
                    uVar15 = -uVar30;
                    if (0 < (int)uVar30) {
                      uVar15 = uVar30;
                    }
                    if (uVar26 <= uVar15) {
                      bVar19 = bVar9;
                    }
                    if (uVar15 < uVar35) {
                      bVar17 = bVar19;
                    }
                    if (uVar26 < uVar35) {
                      bVar17 = bVar19;
                    }
                    *psVar33 = bVar17 + raw[uVar16];
                    uVar16 = uVar16 + 1;
                    pbVar34 = pbVar34 + 1;
                    psVar33 = psVar33 + 1;
                  } while (uVar11 != uVar16);
                }
                break;
              case 5:
                if (0 < (int)uVar11) {
                  uVar16 = 0;
                  do {
                    psVar33[uVar16] = (psVar7[uVar16 + (lVar23 - (int)uVar4)] >> 1) + raw[uVar16];
                    uVar16 = uVar16 + 1;
                  } while (uVar11 != uVar16);
                }
                break;
              case 6:
                if (0 < (int)uVar11) {
                  uVar16 = 0;
                  do {
                    psVar33[uVar16] = psVar7[uVar16 + (lVar23 - (int)uVar4)] + raw[uVar16];
                    uVar16 = uVar16 + 1;
                  } while (uVar11 != uVar16);
                }
              }
              raw = raw + (int)uVar11;
              iVar5 = 0;
LAB_001bd257:
              if (lVar18 + 1U == uVar8) {
                if (depth < 8) {
                  if (y == 0) {
                    return 1;
                  }
                  uVar4 = x - 1;
                  lVar12 = uVar2 - uVar22;
                  lVar29 = (ulong)uVar4 + 1;
                  uVar20 = 0;
                  uVar16 = 0;
                  do {
                    bVar17 = 1;
                    if (color == 0) {
                      bVar17 = ""[depth];
                    }
                    psVar7 = a->out;
                    pbVar28 = psVar7 + uVar3 * (int)uVar16;
                    pbVar34 = pbVar28 + (uVar2 - uVar22);
                    uVar24 = (ulong)uVar20;
                    if (depth == 4) {
                      uVar11 = uVar10;
                      if (1 < (int)uVar10) {
                        psVar33 = psVar7 + lVar12;
                        uVar35 = uVar10;
                        do {
                          psVar7[uVar24] = (psVar33[uVar24] >> 4) * bVar17;
                          psVar7[uVar24 + 1] = (psVar33[uVar24] & 0xf) * bVar17;
                          uVar11 = uVar35 - 2;
                          psVar33 = psVar33 + 1;
                          psVar7 = psVar7 + 2;
                          bVar36 = 3 < uVar35;
                          uVar35 = uVar11;
                        } while (bVar36);
                        pbVar34 = psVar33 + uVar24;
                        pbVar28 = psVar7 + uVar24;
                      }
                      if (uVar11 == 1) {
                        *pbVar28 = (*pbVar34 >> 4) * bVar17;
                      }
                    }
                    else if (depth == 2) {
                      uVar11 = uVar10;
                      if (3 < (int)uVar10) {
                        psVar33 = psVar7 + lVar12;
                        uVar35 = uVar10;
                        do {
                          psVar7[uVar24] = (psVar33[uVar24] >> 6) * bVar17;
                          psVar7[uVar24 + 1] = (psVar33[uVar24] >> 4 & 3) * bVar17;
                          psVar7[uVar24 + 2] = (psVar33[uVar24] >> 2 & 3) * bVar17;
                          psVar7[uVar24 + 3] = (psVar33[uVar24] & 3) * bVar17;
                          uVar11 = uVar35 - 4;
                          psVar33 = psVar33 + 1;
                          psVar7 = psVar7 + 4;
                          bVar36 = 7 < uVar35;
                          uVar35 = uVar11;
                        } while (bVar36);
                        pbVar34 = psVar33 + uVar24;
                        pbVar28 = psVar7 + uVar24;
                      }
                      if (((0 < (int)uVar11) && (*pbVar28 = (*pbVar34 >> 6) * bVar17, uVar11 != 1))
                         && (pbVar28[1] = (*pbVar34 >> 4 & 3) * bVar17, uVar11 == 3)) {
                        pbVar28[2] = (*pbVar34 >> 2 & 3) * bVar17;
                      }
                    }
                    else if (depth == 1) {
                      uVar11 = uVar10;
                      if (7 < (int)uVar10) {
                        psVar33 = psVar7 + lVar12;
                        uVar35 = uVar10;
                        do {
                          psVar7[uVar24] = (char)psVar33[uVar24] >> 7 & bVar17;
                          psVar7[uVar24 + 1] = (char)(psVar33[uVar24] * '\x02') >> 7 & bVar17;
                          psVar7[uVar24 + 2] = (char)(psVar33[uVar24] << 2) >> 7 & bVar17;
                          psVar7[uVar24 + 3] = (char)(psVar33[uVar24] << 3) >> 7 & bVar17;
                          psVar7[uVar24 + 4] = (char)(psVar33[uVar24] << 4) >> 7 & bVar17;
                          psVar7[uVar24 + 5] = (char)(psVar33[uVar24] << 5) >> 7 & bVar17;
                          psVar7[uVar24 + 6] = (char)(psVar33[uVar24] << 6) >> 7 & bVar17;
                          bVar9 = bVar17;
                          if ((psVar33[uVar24] & 1) == 0) {
                            bVar9 = 0;
                          }
                          psVar7[uVar24 + 7] = bVar9;
                          uVar11 = uVar35 - 8;
                          psVar33 = psVar33 + 1;
                          psVar7 = psVar7 + 8;
                          bVar36 = 0xf < uVar35;
                          uVar35 = uVar11;
                        } while (bVar36);
                        pbVar34 = psVar33 + uVar24;
                        pbVar28 = psVar7 + uVar24;
                      }
                      if (((((0 < (int)uVar11) &&
                            (*pbVar28 = (char)*pbVar34 >> 7 & bVar17, uVar11 != 1)) &&
                           ((pbVar28[1] = (char)(*pbVar34 * '\x02') >> 7 & bVar17, 2 < uVar11 &&
                            ((pbVar28[2] = (char)(*pbVar34 << 2) >> 7 & bVar17, uVar11 != 3 &&
                             (pbVar28[3] = (char)(*pbVar34 << 3) >> 7 & bVar17, 4 < uVar11)))))) &&
                          (pbVar28[4] = (char)(*pbVar34 << 4) >> 7 & bVar17, uVar11 != 5)) &&
                         (pbVar28[5] = (char)(*pbVar34 << 5) >> 7 & bVar17, uVar11 == 7)) {
                        pbVar28[6] = (char)(*pbVar34 << 6) >> 7 & bVar17;
                      }
                    }
                    if (a_00 != out_n) {
                      psVar7 = a->out;
                      if (a_00 == 1) {
                        lVar18 = lVar29;
                        if (-1 < (int)uVar4) {
                          do {
                            psVar7[lVar18 * 2 + (uVar24 - 1)] = 0xff;
                            psVar7[lVar18 * 2 + (uVar24 - 2)] = psVar7[lVar18 + (uVar24 - 1)];
                            lVar27 = lVar18 + -1;
                            bVar36 = 0 < lVar18;
                            lVar18 = lVar27;
                          } while (lVar27 != 0 && bVar36);
                        }
                      }
                      else if (-1 < (int)uVar4) {
                        psVar33 = psVar7 + (ulong)uVar4 * 3 + 2 + uVar24;
                        lVar18 = lVar29;
                        do {
                          psVar7[lVar18 * 4 + (uVar24 - 1)] = 0xff;
                          psVar7[lVar18 * 4 + (uVar24 - 2)] = *psVar33;
                          psVar7[lVar18 * 4 + (uVar24 - 3)] = psVar33[-1];
                          psVar7[lVar18 * 4 + (uVar24 - 4)] = psVar33[-2];
                          psVar33 = psVar33 + -3;
                          lVar27 = lVar18 + -1;
                          bVar36 = 0 < lVar18;
                          lVar18 = lVar27;
                        } while (lVar27 != 0 && bVar36);
                      }
                    }
                    uVar16 = uVar16 + 1;
                    uVar20 = uVar20 + uVar3;
                  } while (uVar16 != uVar8);
                  return 1;
                }
                goto LAB_001bd681;
              }
            }
            else {
              switch(bVar17) {
              case 0:
                if (iVar6 != 0) {
                  iVar21 = iVar6;
                  do {
                    if (0 < (int)uVar4) {
                      uVar24 = 0;
                      do {
                        psVar33[uVar24] = raw[uVar24];
                        uVar24 = uVar24 + 1;
                      } while (uVar4 != uVar24);
                    }
                    psVar33[(int)uVar4] = 0xff;
                    raw = raw + (int)uVar4;
                    psVar33 = psVar33 + lVar27;
                    iVar21 = iVar21 + -1;
                  } while (iVar21 != 0);
                }
                break;
              case 1:
                if (iVar6 != 0) {
                  psVar7 = psVar7 + lVar23 + lVar12;
                  iVar21 = iVar6;
                  do {
                    if (0 < (int)uVar4) {
                      uVar24 = 0;
                      do {
                        psVar33[uVar24] = psVar7[uVar24] + raw[uVar24];
                        uVar24 = uVar24 + 1;
                      } while (uVar4 != uVar24);
                    }
                    psVar33[(int)uVar4] = 0xff;
                    raw = raw + (int)uVar4;
                    psVar33 = psVar33 + lVar27;
                    psVar7 = psVar7 + lVar27;
                    iVar21 = iVar21 + -1;
                  } while (iVar21 != 0);
                }
                break;
              case 2:
                if (iVar6 != 0) {
                  iVar21 = iVar6;
                  do {
                    if (0 < (int)uVar4) {
                      uVar24 = 0;
                      do {
                        psVar33[uVar24] = psVar33[uVar24 + lVar32] + raw[uVar24];
                        uVar24 = uVar24 + 1;
                      } while (uVar4 != uVar24);
                    }
                    psVar33[(int)uVar4] = 0xff;
                    raw = raw + (int)uVar4;
                    psVar33 = psVar33 + lVar27;
                    iVar21 = iVar21 + -1;
                  } while (iVar21 != 0);
                }
                break;
              case 3:
                if (iVar6 != 0) {
                  iVar21 = iVar6;
                  do {
                    if (0 < (int)uVar4) {
                      uVar24 = 0;
                      psVar7 = psVar33;
                      do {
                        *psVar7 = (char)((uint)psVar7[lVar12] + (uint)psVar7[lVar32] >> 1) +
                                  raw[uVar24];
                        uVar24 = uVar24 + 1;
                        psVar7 = psVar7 + 1;
                      } while (uVar4 != uVar24);
                    }
                    psVar33[(int)uVar4] = 0xff;
                    raw = raw + (int)uVar4;
                    psVar33 = psVar33 + lVar27;
                    iVar21 = iVar21 + -1;
                  } while (iVar21 != 0);
                }
                break;
              case 4:
                if (iVar6 != 0) {
                  psVar14 = psVar7 + lVar23 + lVar32;
                  psVar25 = psVar7 + lVar23 + lVar12;
                  psVar7 = psVar7 + lVar23 + (lVar12 - (ulong)uVar3);
                  iVar21 = iVar6;
                  do {
                    if (0 < (int)uVar4) {
                      uVar24 = 0;
                      do {
                        bVar17 = psVar25[uVar24];
                        bVar9 = psVar14[uVar24];
                        bVar19 = psVar7[uVar24];
                        iVar5 = ((uint)bVar9 + (uint)bVar17) - (uint)bVar19;
                        uVar35 = iVar5 - (uint)bVar17;
                        uVar11 = -uVar35;
                        if (0 < (int)uVar35) {
                          uVar11 = uVar35;
                        }
                        uVar26 = iVar5 - (uint)bVar9;
                        uVar35 = -uVar26;
                        if (0 < (int)uVar26) {
                          uVar35 = uVar26;
                        }
                        uVar15 = iVar5 - (uint)bVar19;
                        uVar26 = -uVar15;
                        if (0 < (int)uVar15) {
                          uVar26 = uVar15;
                        }
                        if (uVar35 <= uVar26) {
                          bVar19 = bVar9;
                        }
                        if (uVar26 < uVar11) {
                          bVar17 = bVar19;
                        }
                        if (uVar35 < uVar11) {
                          bVar17 = bVar19;
                        }
                        psVar33[uVar24] = bVar17 + raw[uVar24];
                        uVar24 = uVar24 + 1;
                      } while (uVar4 != uVar24);
                    }
                    psVar33[(int)uVar4] = 0xff;
                    raw = raw + (int)uVar4;
                    psVar33 = psVar33 + lVar27;
                    psVar14 = psVar14 + lVar27;
                    psVar25 = psVar25 + lVar27;
                    psVar7 = psVar7 + lVar27;
                    iVar21 = iVar21 + -1;
                    iVar5 = 0;
                  } while (iVar21 != 0);
                }
                break;
              case 5:
                if (iVar6 != 0) {
                  psVar7 = psVar7 + lVar23 + lVar12;
                  iVar21 = iVar6;
                  do {
                    if (0 < (int)uVar4) {
                      uVar24 = 0;
                      do {
                        psVar33[uVar24] = (psVar7[uVar24] >> 1) + raw[uVar24];
                        uVar24 = uVar24 + 1;
                      } while (uVar4 != uVar24);
                    }
                    psVar33[(int)uVar4] = 0xff;
                    raw = raw + (int)uVar4;
                    psVar33 = psVar33 + lVar27;
                    psVar7 = psVar7 + lVar27;
                    iVar21 = iVar21 + -1;
                  } while (iVar21 != 0);
                }
                break;
              case 6:
                if (iVar6 != 0) {
                  psVar7 = psVar7 + lVar23 + lVar12;
                  iVar21 = iVar6;
                  do {
                    if (0 < (int)uVar4) {
                      uVar24 = 0;
                      do {
                        psVar33[uVar24] = psVar7[uVar24] + raw[uVar24];
                        uVar24 = uVar24 + 1;
                      } while (uVar4 != uVar24);
                    }
                    psVar33[(int)uVar4] = 0xff;
                    raw = raw + (int)uVar4;
                    psVar33 = psVar33 + lVar27;
                    psVar7 = psVar7 + lVar27;
                    iVar21 = iVar21 + -1;
                  } while (iVar21 != 0);
                }
              }
              if (depth != 0x10) goto LAB_001bd257;
              if (x != 0) {
                psVar7 = a->out + (long)(int)uVar4 + uVar16 + 1;
                uVar16 = (ulong)x;
                do {
                  *psVar7 = 0xff;
                  psVar7 = psVar7 + lVar27;
                  uVar11 = (int)uVar16 - 1;
                  uVar16 = (ulong)uVar11;
                } while (uVar11 != 0);
                goto LAB_001bd257;
              }
              if (lVar18 + 1U == uVar8) goto LAB_001bd690;
            }
            lVar18 = lVar18 + 1;
            uVar16 = (ulong)(uVar3 * (int)lVar18);
            psVar7 = a->out + uVar16;
            bVar17 = *raw;
          } while (bVar17 < 5);
          pcVar31 = "invalid filter";
          goto LAB_001bcbb6;
        }
      }
    }
  }
  iVar5 = 0 << bVar36;
LAB_001bcbb6:
  *(char **)(*in_FS_OFFSET + -0x20) = pcVar31;
  return iVar5;
}

Assistant:

static int stbi__create_png_image_raw(stbi__png *a, stbi_uc *raw, stbi__uint32 raw_len, int out_n, stbi__uint32 x, stbi__uint32 y, int depth, int color)
{
   int bytes = (depth == 16? 2 : 1);
   stbi__context *s = a->s;
   stbi__uint32 i,j,stride = x*out_n*bytes;
   stbi__uint32 img_len, img_width_bytes;
   int k;
   int img_n = s->img_n; // copy it into a local for later

   int output_bytes = out_n*bytes;
   int filter_bytes = img_n*bytes;
   int width = x;

   STBI_ASSERT(out_n == s->img_n || out_n == s->img_n+1);
   a->out = (stbi_uc *) stbi__malloc_mad3(x, y, output_bytes, 0); // extra bytes to write off the end into
   if (!a->out) return stbi__err("outofmem", "Out of memory");

   if (!stbi__mad3sizes_valid(img_n, x, depth, 7)) return stbi__err("too large", "Corrupt PNG");
   img_width_bytes = (((img_n * x * depth) + 7) >> 3);
   img_len = (img_width_bytes + 1) * y;

   // we used to check for exact match between raw_len and img_len on non-interlaced PNGs,
   // but issue #276 reported a PNG in the wild that had extra data at the end (all zeros),
   // so just check for raw_len < img_len always.
   if (raw_len < img_len) return stbi__err("not enough pixels","Corrupt PNG");

   for (j=0; j < y; ++j) {
      stbi_uc *cur = a->out + stride*j;
      stbi_uc *prior;
      int filter = *raw++;

      if (filter > 4)
         return stbi__err("invalid filter","Corrupt PNG");

      if (depth < 8) {
         if (img_width_bytes > x) return stbi__err("invalid width","Corrupt PNG");
         cur += x*out_n - img_width_bytes; // store output to the rightmost img_len bytes, so we can decode in place
         filter_bytes = 1;
         width = img_width_bytes;
      }
      prior = cur - stride; // bugfix: need to compute this after 'cur +=' computation above

      // if first row, use special filter that doesn't sample previous row
      if (j == 0) filter = first_row_filter[filter];

      // handle first byte explicitly
      for (k=0; k < filter_bytes; ++k) {
         switch (filter) {
            case STBI__F_none       : cur[k] = raw[k]; break;
            case STBI__F_sub        : cur[k] = raw[k]; break;
            case STBI__F_up         : cur[k] = STBI__BYTECAST(raw[k] + prior[k]); break;
            case STBI__F_avg        : cur[k] = STBI__BYTECAST(raw[k] + (prior[k]>>1)); break;
            case STBI__F_paeth      : cur[k] = STBI__BYTECAST(raw[k] + stbi__paeth(0,prior[k],0)); break;
            case STBI__F_avg_first  : cur[k] = raw[k]; break;
            case STBI__F_paeth_first: cur[k] = raw[k]; break;
         }
      }

      if (depth == 8) {
         if (img_n != out_n)
            cur[img_n] = 255; // first pixel
         raw += img_n;
         cur += out_n;
         prior += out_n;
      } else if (depth == 16) {
         if (img_n != out_n) {
            cur[filter_bytes]   = 255; // first pixel top byte
            cur[filter_bytes+1] = 255; // first pixel bottom byte
         }
         raw += filter_bytes;
         cur += output_bytes;
         prior += output_bytes;
      } else {
         raw += 1;
         cur += 1;
         prior += 1;
      }

      // this is a little gross, so that we don't switch per-pixel or per-component
      if (depth < 8 || img_n == out_n) {
         int nk = (width - 1)*filter_bytes;
         #define STBI__CASE(f) \
             case f:     \
                for (k=0; k < nk; ++k)
         switch (filter) {
            // "none" filter turns into a memcpy here; make that explicit.
            case STBI__F_none:         memcpy(cur, raw, nk); break;
            STBI__CASE(STBI__F_sub)          { cur[k] = STBI__BYTECAST(raw[k] + cur[k-filter_bytes]); } break;
            STBI__CASE(STBI__F_up)           { cur[k] = STBI__BYTECAST(raw[k] + prior[k]); } break;
            STBI__CASE(STBI__F_avg)          { cur[k] = STBI__BYTECAST(raw[k] + ((prior[k] + cur[k-filter_bytes])>>1)); } break;
            STBI__CASE(STBI__F_paeth)        { cur[k] = STBI__BYTECAST(raw[k] + stbi__paeth(cur[k-filter_bytes],prior[k],prior[k-filter_bytes])); } break;
            STBI__CASE(STBI__F_avg_first)    { cur[k] = STBI__BYTECAST(raw[k] + (cur[k-filter_bytes] >> 1)); } break;
            STBI__CASE(STBI__F_paeth_first)  { cur[k] = STBI__BYTECAST(raw[k] + stbi__paeth(cur[k-filter_bytes],0,0)); } break;
         }
         #undef STBI__CASE
         raw += nk;
      } else {
         STBI_ASSERT(img_n+1 == out_n);
         #define STBI__CASE(f) \
             case f:     \
                for (i=x-1; i >= 1; --i, cur[filter_bytes]=255,raw+=filter_bytes,cur+=output_bytes,prior+=output_bytes) \
                   for (k=0; k < filter_bytes; ++k)
         switch (filter) {
            STBI__CASE(STBI__F_none)         { cur[k] = raw[k]; } break;
            STBI__CASE(STBI__F_sub)          { cur[k] = STBI__BYTECAST(raw[k] + cur[k- output_bytes]); } break;
            STBI__CASE(STBI__F_up)           { cur[k] = STBI__BYTECAST(raw[k] + prior[k]); } break;
            STBI__CASE(STBI__F_avg)          { cur[k] = STBI__BYTECAST(raw[k] + ((prior[k] + cur[k- output_bytes])>>1)); } break;
            STBI__CASE(STBI__F_paeth)        { cur[k] = STBI__BYTECAST(raw[k] + stbi__paeth(cur[k- output_bytes],prior[k],prior[k- output_bytes])); } break;
            STBI__CASE(STBI__F_avg_first)    { cur[k] = STBI__BYTECAST(raw[k] + (cur[k- output_bytes] >> 1)); } break;
            STBI__CASE(STBI__F_paeth_first)  { cur[k] = STBI__BYTECAST(raw[k] + stbi__paeth(cur[k- output_bytes],0,0)); } break;
         }
         #undef STBI__CASE

         // the loop above sets the high byte of the pixels' alpha, but for
         // 16 bit png files we also need the low byte set. we'll do that here.
         if (depth == 16) {
            cur = a->out + stride*j; // start at the beginning of the row again
            for (i=0; i < x; ++i,cur+=output_bytes) {
               cur[filter_bytes+1] = 255;
            }
         }
      }